

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool caffe::ReductionParameter_ReductionOp_IsValid(int value)

{
  int value_local;
  
  return value - 1U < 4;
}

Assistant:

bool ReductionParameter_ReductionOp_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
    case 3:
    case 4:
      return true;
    default:
      return false;
  }
}